

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void * icu_63::ZNames::createMetaZoneAndPutInCache
                 (UHashtable *cache,UChar **names,UnicodeString *mzID,UErrorCode *status)

{
  UChar *pUVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  int iVar6;
  UChar *key;
  char *value;
  undefined1 *size;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    key = ZoneMeta::findMetaZoneID(mzID);
    size = EMPTY_NAMES;
    iVar6 = bcmp(names,EMPTY_NAMES,0x38);
    if (iVar6 == 0) {
      value = "<empty>";
    }
    else {
      value = (char *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
      if (value == (char *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_00205eb6;
      }
      value[0x38] = '\0';
      pUVar1 = names[1];
      pUVar2 = names[2];
      pUVar3 = names[3];
      pUVar4 = names[4];
      pUVar5 = names[5];
      *(UChar **)value = *names;
      *(UChar **)(value + 8) = pUVar1;
      *(UChar **)(value + 0x10) = pUVar2;
      *(UChar **)(value + 0x18) = pUVar3;
      *(UChar **)(value + 0x20) = pUVar4;
      *(UChar **)(value + 0x28) = pUVar5;
      *(UChar **)(value + 0x30) = names[6];
      value[0x39] = '\0';
    }
    uhash_put_63(cache,key,value,status);
  }
  else {
LAB_00205eb6:
    value = (char *)0x0;
  }
  return value;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }